

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  u8 *puVar1;
  byte bVar2;
  MemPage *pPage;
  ushort uVar3;
  int iVar4;
  u32 key;
  Pgno PVar5;
  int iVar6;
  BtShared *pBVar7;
  long lVar8;
  ulong uVar9;
  Pgno PVar10;
  Btree *pBtree;
  void *pvVar11;
  u8 uVar12;
  uint uVar13;
  u64 v;
  MemPage *pPage_00;
  u8 uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uchar *pCell;
  uint uVar18;
  u8 *puVar19;
  uint local_bc;
  ulong local_b8;
  u8 *local_b0;
  int loc;
  Pgno local_a4;
  Btree *local_a0;
  BtreePayload *local_98;
  BtCursor *local_90;
  u8 *local_88;
  uint local_80;
  int rc;
  MemPage *local_78;
  uint *local_70;
  BtShared *local_68;
  UnpackedRecord r;
  
  pBtree = pCur->pBtree;
  uVar18 = local_bc;
  loc = seekResult;
  if ((pCur->curFlags & 0x20) != 0) {
    local_bc = saveAllCursors(pBtree->pBt,pCur->pgnoRoot,pCur);
    if (local_bc != 0) {
      return local_bc;
    }
    uVar18 = 0;
    if ((seekResult != 0) && (pCur->iPage < '\0')) {
      iVar4 = sqlite3CorruptError(0x13803);
      return iVar4;
    }
  }
  local_bc = uVar18;
  if ((2 < pCur->eState) && (local_bc = moveToRoot(pCur), (local_bc & 0xffffffef) != 0)) {
    return local_bc;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    if (pBtree->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    }
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if (seekResult == 0) {
        iVar4 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&loc);
        if (iVar4 != 0) {
          return iVar4;
        }
        local_bc = 0;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar4 = btreeOverwriteCell(pCur,pX);
      return iVar4;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        iVar4 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&loc);
      }
      else {
        r.aMem = pX->aMem;
        r.default_rc = '\0';
        r.eqSeen = '\0';
        r.pKeyInfo = pCur->pKeyInfo;
        r.nField = pX->nMem;
        iVar4 = sqlite3BtreeIndexMoveto(pCur,&r,&loc);
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      local_bc = 0;
      seekResult = loc;
    }
    if (seekResult == 0) {
      getCellInfo(pCur);
      lVar8 = (pCur->info).nKey;
      if (lVar8 == pX->nKey) {
        r.u = (anon_union_8_2_94730112_for_u)pX->pKey;
        r._36_4_ = SUB84(lVar8,0);
        iVar4 = btreeOverwriteCell(pCur,(BtreePayload *)&r);
        return iVar4;
      }
    }
  }
  pPage = pCur->pPage;
  if (pPage->nFree < 0) {
    if (1 < pCur->eState) {
      iVar4 = 0x1387e;
      goto LAB_0013ff1b;
    }
    iVar4 = btreeComputeFreeSpace(pPage);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_bc = 0;
  }
  pBVar7 = pBtree->pBt;
  local_b0 = pBVar7->pTmpSpace;
  if ((char)(byte)flags < '\0') {
    local_bc = 0;
    uVar9 = (ulong)(uint)pBVar7->nPreformatSize;
    if (pBVar7->nPreformatSize < 4) {
      uVar9 = 4;
      local_b0[3] = '\0';
      pBVar7 = pBtree->pBt;
    }
    pX = pX;
    if ((pBVar7->autoVacuum != '\0') && (pX = pX, (uint)pPage->maxLocal < (uint)uVar9)) {
      local_b8 = uVar9;
      local_a0 = pBtree;
      (*pPage->xParseCell)(pPage,local_b0,(CellInfo *)&r);
      uVar9 = local_b8;
      pBtree = local_a0;
      if (r.u.i._0_4_ != (uint)(ushort)r.u.i._4_2_) {
        key = sqlite3Get4byte(local_b0 + ((local_b8 & 0xffffffff) - 4));
        ptrmapPut(local_a0->pBt,key,'\x03',pPage->pgno,(int *)&local_bc);
        uVar9 = local_b8;
        pBtree = local_a0;
        if (local_bc != 0) {
          return local_bc;
        }
      }
    }
  }
  else {
    bVar2 = pPage->childPtrSize;
    local_98 = pX;
    if (pPage->intKey == '\0') {
      pvVar11 = pX->pKey;
      uVar17 = pX->nKey;
      if ((uint)uVar17 < 0x80) {
        local_b0[bVar2] = (u8)uVar17;
        uVar18 = 1;
        local_a0 = pBtree;
      }
      else {
        local_a0 = pBtree;
        uVar18 = sqlite3PutVarint(local_b0 + bVar2,(long)(int)(uint)uVar17);
        uVar18 = uVar18 & 0xff;
      }
      iVar4 = uVar18 + bVar2;
      v = uVar17 & 0xffffffff;
    }
    else {
      uVar17 = (ulong)pX->nData;
      v = (long)pX->nZero + uVar17;
      pvVar11 = pX->pData;
      if ((uint)v < 0x80) {
        uVar18 = 1;
        local_b0[bVar2] = (u8)v;
        local_a0 = pBtree;
      }
      else {
        local_a0 = pBtree;
        uVar18 = sqlite3PutVarint(local_b0 + bVar2,v);
        uVar18 = uVar18 & 0xff;
      }
      uVar18 = uVar18 + bVar2;
      iVar4 = sqlite3PutVarint(local_b0 + uVar18,local_98->nKey);
      iVar4 = iVar4 + uVar18;
    }
    puVar19 = local_b0 + iVar4;
    iVar6 = (int)v;
    if ((int)(uint)pPage->maxLocal < iVar6) {
      uVar3 = pPage->minLocal;
      local_68 = pPage->pBt;
      local_78 = (MemPage *)0x0;
      uVar18 = (iVar6 - (uint)uVar3) % (local_68->usableSize - 4) + (uint)uVar3;
      if ((int)(uint)pPage->maxLocal < (int)uVar18) {
        uVar18 = (uint)uVar3;
      }
      local_b8 = (ulong)(iVar4 + uVar18 + 4);
      local_a4 = 0;
      local_70 = (uint *)(local_b0 + (int)(uVar18 + iVar4));
      local_90 = pCur;
      while( true ) {
        uVar16 = (uint)v;
        uVar13 = uVar18;
        if ((int)uVar16 < (int)uVar18) {
          uVar13 = uVar16;
        }
        uVar15 = (uint)uVar17;
        if ((int)uVar15 < (int)uVar13) {
          if ((int)uVar15 < 1) {
            memset(puVar19,0,(long)(int)uVar13);
          }
          else {
            memcpy(puVar19,pvVar11,uVar17 & 0xffffffff);
            uVar13 = uVar15;
          }
        }
        else {
          memcpy(puVar19,pvVar11,(long)(int)uVar13);
        }
        pBVar7 = local_68;
        v = (u64)(uVar16 - uVar13);
        if (uVar16 - uVar13 == 0 || (int)uVar16 < (int)uVar13) break;
        puVar19 = puVar19 + (int)uVar13;
        pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar13);
        uVar17 = (ulong)(uVar15 - uVar13);
        uVar18 = uVar18 - uVar13;
        if (uVar18 == 0) {
          r.pKeyInfo = (KeyInfo *)0x0;
          local_80 = local_a4;
          if (local_68->autoVacuum != '\0') {
            local_88 = (u8 *)CONCAT44(local_88._4_4_,sqlite3PendingByte);
            PVar10 = local_a4;
            do {
              do {
                uVar18 = PVar10;
                PVar10 = uVar18 + 1;
                PVar5 = ptrmapPageno(pBVar7,PVar10);
              } while (PVar10 == PVar5);
            } while (uVar18 == (uint)local_88 / pBVar7->pageSize);
            local_a4 = uVar18 + 1;
          }
          iVar4 = allocateBtreePage(pBVar7,(MemPage **)&r,&local_a4,local_a4,'\0');
          PVar10 = local_a4;
          rc = iVar4;
          if ((pBVar7->autoVacuum == '\0') || (iVar4 != 0)) {
            pPage_00 = local_78;
            if (iVar4 != 0) goto LAB_00140186;
          }
          else {
            ptrmapPut(pBVar7,local_a4,'\x04' - (local_80 == 0),local_80,&rc);
            pPage_00 = local_78;
            iVar4 = rc;
            if (rc != 0) {
              releasePage((MemPage *)r.pKeyInfo);
LAB_00140186:
              releasePage(pPage_00);
              return iVar4;
            }
          }
          *local_70 = PVar10 >> 0x18 | (PVar10 & 0xff0000) >> 8 | (PVar10 & 0xff00) << 8 |
                      PVar10 << 0x18;
          releasePage(local_78);
          local_78 = (MemPage *)r.pKeyInfo;
          local_70 = *(uint **)(r.pKeyInfo + 2);
          *local_70 = 0;
          puVar19 = (u8 *)(*(long *)(r.pKeyInfo + 2) + 4);
          uVar18 = local_68->usableSize - 4;
        }
      }
      releasePage(local_78);
      uVar9 = local_b8;
      pBtree = local_a0;
      pX = local_98;
      pCur = local_90;
    }
    else {
      uVar9 = (ulong)(uint)(iVar4 + iVar6);
      if (iVar4 + iVar6 < 4) {
        puVar19[iVar6] = '\0';
        uVar9 = 4;
      }
      iVar4 = (int)uVar17;
      memcpy(puVar19,pvVar11,(long)iVar4);
      memset(puVar19 + iVar4,0,(long)(iVar6 - iVar4));
      pBtree = local_a0;
      pX = local_98;
    }
  }
  uVar3 = pCur->ix;
  uVar17 = (ulong)uVar3;
  (pCur->info).nSize = 0;
  if (loc == 0) {
    if (pPage->nCell <= uVar3) {
      iVar4 = 0x138a8;
LAB_0013ff1b:
      iVar4 = sqlite3CorruptError(iVar4);
      return iVar4;
    }
    local_b8 = uVar9;
    local_a0 = pBtree;
    iVar4 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar4 != 0) {
      return iVar4;
    }
    pCell = pPage->aData +
            (CONCAT11(pPage->aCellIdx[uVar17 * 2],pPage->aCellIdx[uVar17 * 2 + 1]) & pPage->maskPage
            );
    if (pPage->leaf == '\0') {
      *(undefined4 *)local_b0 = *(undefined4 *)pCell;
    }
    (*pPage->xParseCell)(pPage,pCell,(CellInfo *)&r);
    uVar18 = 0;
    if (r.u.i._0_4_ != (uint)(ushort)r.u.i._4_2_) {
      uVar18 = clearCellOverflow(pPage,pCell,(CellInfo *)&r);
    }
    pCur->curFlags = pCur->curFlags & 0xfb;
    local_bc = uVar18;
    if ((uint)local_b8 == (ushort)r.u.i._6_2_) {
      if ((r.u.i._0_4_ == (uint)(ushort)r.u.i._4_2_) &&
         ((local_a0->pBt->autoVacuum == '\0' || ((uint)local_b8 < pPage->minLocal)))) {
        if (pCell < pPage->aData + (ulong)pPage->hdrOffset + 10) {
          iVar4 = 0x138c3;
        }
        else {
          if (pCell + (local_b8 & 0xffffffff) <= pPage->aDataEnd) {
            memcpy(pCell,local_b0,local_b8 & 0xffffffff);
            return 0;
          }
          iVar4 = 0x138c6;
        }
        goto LAB_0013ff1b;
      }
    }
    dropCell(pPage,(uint)uVar3,(uint)(ushort)r.u.i._6_2_,(int *)&local_bc);
    uVar9 = local_b8;
    if (local_bc != 0) {
      return local_bc;
    }
  }
  else if ((loc < 0) && (pPage->nCell != 0)) {
    pCur->ix = uVar3 + 1;
    uVar17 = (ulong)(ushort)(uVar3 + 1);
    pCur->curFlags = pCur->curFlags & 0xf9;
  }
  uVar18 = (int)uVar9 + 2;
  if (pPage->nFree < (int)uVar18) {
    bVar2 = pPage->nOverflow;
    pPage->nOverflow = bVar2 + 1;
    pPage->apOvfl[bVar2] = local_b0;
    pPage->aiOvfl[bVar2] = (u16)uVar17;
  }
  else {
    local_b8 = uVar9;
    iVar4 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar4 != 0) goto LAB_0013fe96;
    puVar19 = pPage->aData;
    uVar9 = (ulong)pPage->hdrOffset;
    r.pKeyInfo = (KeyInfo *)((ulong)r.pKeyInfo & 0xffffffff00000000);
    uVar16 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
    uVar3 = *(ushort *)(puVar19 + uVar9 + 5) << 8 | *(ushort *)(puVar19 + uVar9 + 5) >> 8;
    uVar13 = (uint)uVar3;
    local_98 = pX;
    local_90 = pCur;
    if (uVar3 < uVar16) {
      iVar4 = 0x11ac3;
      if ((uVar13 != 0) || (uVar13 = 0x10000, pPage->pBt->usableSize != 0x10000)) {
LAB_0013fe7b:
        iVar4 = sqlite3CorruptError(iVar4);
        pX = local_98;
        pCur = local_90;
        goto LAB_0013fe96;
      }
    }
    else {
      iVar4 = 0x11ac6;
      if ((int)pPage->pBt->usableSize < (int)uVar13) goto LAB_0013fe7b;
    }
    local_88 = puVar19;
    if (puVar19[uVar9 + 2] == '\0') {
      if ((puVar19[uVar9 + 1] == '\0') || (uVar13 < uVar16 + 2)) goto LAB_0014001b;
LAB_0013ffc7:
      puVar19 = pageFindSlot(pPage,(int)local_b8,(int *)&r);
      pCur = local_90;
      if (puVar19 == (u8 *)0x0) {
        pX = local_98;
        iVar4 = (int)r.pKeyInfo;
        if ((int)r.pKeyInfo != 0) goto LAB_0013fe96;
        goto LAB_0014001b;
      }
      lVar8 = (long)puVar19 - (long)local_88;
      iVar4 = (int)lVar8;
      if (iVar4 <= (int)uVar16) {
        iVar4 = sqlite3CorruptError(0x11ad7);
        pX = local_98;
        goto LAB_0013fe96;
      }
      uVar14 = (u8)((ulong)lVar8 >> 8);
      uVar12 = (u8)lVar8;
      iVar6 = (int)local_b8;
    }
    else {
      if (uVar16 + 2 <= uVar13) goto LAB_0013ffc7;
LAB_0014001b:
      if ((int)uVar13 < (int)(uVar16 + uVar18)) {
        iVar6 = pPage->nFree - uVar18;
        iVar4 = 4;
        if (iVar6 < 4) {
          iVar4 = iVar6;
        }
        iVar4 = defragmentPage(pPage,iVar4);
        pX = local_98;
        pCur = local_90;
        if (iVar4 != 0) goto LAB_0013fe96;
        uVar13 = (((uint)local_88[uVar9 + 5] * 0x100 + (uint)local_88[uVar9 + 6]) - 1 & 0xffff) + 1;
      }
      iVar6 = (int)local_b8;
      iVar4 = uVar13 - iVar6;
      uVar12 = (u8)iVar4;
      uVar14 = (u8)((uint)iVar4 >> 8);
      *(ushort *)(local_88 + uVar9 + 5) = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
    }
    puVar1 = local_88;
    pCur = local_90;
    pPage->nFree = pPage->nFree - (uVar18 & 0xffff);
    memcpy(local_88 + iVar4,local_b0,(long)iVar6);
    puVar19 = pPage->aCellIdx + uVar17 * 2;
    memmove(puVar19 + 2,pPage->aCellIdx + uVar17 * 2,(pPage->nCell - uVar17) * 2);
    pX = local_98;
    *puVar19 = uVar14;
    puVar19[1] = uVar12;
    pPage->nCell = pPage->nCell + 1;
    puVar19 = puVar1 + (ulong)pPage->hdrOffset + 4;
    *puVar19 = *puVar19 + '\x01';
    if (*puVar19 == '\0') {
      puVar1 = puVar1 + (ulong)pPage->hdrOffset + 3;
      *puVar1 = *puVar1 + '\x01';
    }
    if (pPage->pBt->autoVacuum != '\0') {
      r.pKeyInfo = (KeyInfo *)((ulong)r.pKeyInfo & 0xffffffff00000000);
      ptrmapPutOvflPtr(pPage,pPage,local_b0,(int *)&r);
      iVar4 = (int)r.pKeyInfo;
      if ((int)r.pKeyInfo != 0) goto LAB_0013fe96;
    }
  }
  iVar4 = 0;
LAB_0013fe96:
  if (pPage->nOverflow != '\0') {
    pCur->curFlags = pCur->curFlags & 0xf9;
    iVar4 = balance(pCur);
    pCur->pPage->nOverflow = '\0';
    pCur->eState = '\x01';
    if ((iVar4 == 0 & (byte)flags >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur);
      iVar4 = 0;
      if (pCur->pKeyInfo != (KeyInfo *)0x0) {
        pvVar11 = sqlite3Malloc(pX->nKey);
        pCur->pKey = pvVar11;
        if (pvVar11 == (void *)0x0) {
          iVar4 = 7;
        }
        else {
          memcpy(pvVar11,pX->pKey,pX->nKey);
        }
      }
      pCur->eState = '\x03';
      pCur->nKey = pX->nKey;
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(p->pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && p->pBt->inTransaction==TRANS_WRITE
              && (p->pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) || CORRUPT_DB );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%u nkey=%lld ndata=%u page=%u %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = p->pBt->pTmpSpace;
  assert( newCell!=0 );
  assert( BTREE_PREFORMAT==OPFLAG_PREFORMAT );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = p->pBt->nPreformatSize;
    if( szNew<4 ){
      szNew = 4;
      newCell[3] = 0;
    }
    if( ISAUTOVACUUM(p->pBt) && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(p->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
        if( NEVER(rc) ) goto end_insert;
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
    if( rc ) goto end_insert;
  }
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(p->pBt) );
  idx = pCur->ix;
  pCur->info.nSize = 0;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM(p->pBt) || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  }else{
    assert( pPage->leaf );
  }
  rc = insertCellFast(pPage, idx, newCell, szNew);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}